

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.cpp
# Opt level: O0

void __thiscall license::os::DmiInfo::DmiInfo(DmiInfo *this)

{
  char *pcVar1;
  long lVar2;
  string *psVar3;
  size_t in_RCX;
  exception *e_2;
  undefined1 local_118 [7];
  char last_char_1;
  exception *e_1;
  undefined1 local_e8 [7];
  char last_char;
  string local_c8;
  string local_a8;
  exception *e;
  string local_70;
  string local_50;
  string local_30;
  DmiInfo *local_10;
  DmiInfo *this_local;
  
  this->_vptr_DmiInfo = (_func_int **)&PTR__DmiInfo_005ca950;
  local_10 = this;
  std::__cxx11::string::string((string *)&this->m_sys_vendor);
  std::__cxx11::string::string((string *)&this->m_bios_vendor);
  std::__cxx11::string::string((string *)&this->m_bios_description);
  std::__cxx11::string::string((string *)&this->m_cpu_manufacturer);
  this->m_cpu_cores = 0;
  get_file_contents_abi_cxx11_
            (&local_70,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,in_RCX);
  trim_copy(&local_50,&local_70);
  toupper_copy(&local_30,&local_50);
  std::__cxx11::string::operator=((string *)&this->m_bios_vendor,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  get_file_contents_abi_cxx11_
            ((string *)local_e8,(license *)"/sys/class/dmi/id/modalias",(char *)0x100,in_RCX);
  trim_copy(&local_c8,(string *)local_e8);
  toupper_copy(&local_a8,&local_c8);
  std::__cxx11::string::operator=((string *)&this->m_bios_description,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_bios_description);
  e_1._7_1_ = *pcVar1;
  if ((e_1._7_1_ == '\r') || (e_1._7_1_ == '\n')) {
    lVar2 = std::__cxx11::string::length();
    psVar3 = (string *)std::__cxx11::string::erase((ulong)&this->m_bios_description,lVar2 - 1);
    std::__cxx11::string::operator=((string *)&this->m_bios_description,psVar3);
  }
  get_file_contents_abi_cxx11_
            ((string *)local_118,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,in_RCX);
  std::__cxx11::string::operator=((string *)&this->m_sys_vendor,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->m_sys_vendor);
  if ((*pcVar1 == '\r') || (*pcVar1 == '\n')) {
    lVar2 = std::__cxx11::string::length();
    psVar3 = (string *)std::__cxx11::string::erase((ulong)&this->m_sys_vendor,lVar2 - 1);
    std::__cxx11::string::operator=((string *)&this->m_sys_vendor,psVar3);
  }
  return;
}

Assistant:

DmiInfo::DmiInfo() {
	try {
		m_bios_vendor = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/sys_vendor", 256)));
	} catch (const std::exception& e) {
		m_bios_vendor = "";
		LOG_DEBUG("Can not read sys_vendor %s", e.what());
	}
	try {
		m_bios_description = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/modalias", 256)));
		char last_char = m_bios_description[m_bios_description.length() - 1];
		if (last_char == '\r' || last_char == '\n') {
			m_bios_description = m_bios_description.erase(m_bios_description.length() - 1);
		}
	} catch (const std::exception& e) {
		m_bios_description = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
	try {
		m_sys_vendor = get_file_contents("/sys/class/dmi/id/sys_vendor", 256);
		char last_char = m_sys_vendor[m_sys_vendor.length() - 2];
		if (last_char == '\r' || last_char == '\n') {
			m_sys_vendor = m_sys_vendor.erase(m_sys_vendor.length() - 1);
		}
	} catch (const std::exception& e) {
		m_sys_vendor = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
}